

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BranchSet.cpp
# Opt level: O0

double Hpipe::anon_unknown_5::cost_and_freq(Node *node,double cost)

{
  bool bVar1;
  Node *pNVar2;
  double dVar3;
  double dVar4;
  double cost_local;
  Node *node_local;
  
  bVar1 = AutoPtr::operator_cast_to_bool((AutoPtr *)&node->ok);
  if (bVar1) {
    pNVar2 = AutoPtr<Hpipe::BranchSet::Node,_Hpipe::Delete>::operator->(&node->ok);
    dVar3 = pNVar2->freq;
    pNVar2 = AutoPtr<Hpipe::BranchSet::Node,_Hpipe::Delete>::operator->(&node->ko);
    if (dVar3 < pNVar2->freq || dVar3 == pNVar2->freq) {
      pNVar2 = AutoPtr<Hpipe::BranchSet::Node,_Hpipe::Delete>::ptr(&node->ok);
      dVar3 = cost_and_freq(pNVar2,cost + 1.0 + 6.0);
      pNVar2 = AutoPtr<Hpipe::BranchSet::Node,_Hpipe::Delete>::ptr(&node->ko);
      dVar4 = cost_and_freq(pNVar2,cost + 1.0 + 0.0);
      node_local = (Node *)(dVar3 + dVar4);
    }
    else {
      pNVar2 = AutoPtr<Hpipe::BranchSet::Node,_Hpipe::Delete>::ptr(&node->ok);
      dVar3 = cost_and_freq(pNVar2,cost + 1.0 + 0.0);
      pNVar2 = AutoPtr<Hpipe::BranchSet::Node,_Hpipe::Delete>::ptr(&node->ko);
      dVar4 = cost_and_freq(pNVar2,cost + 1.0 + 6.0);
      node_local = (Node *)(dVar3 + dVar4);
    }
  }
  else {
    node_local = (Node *)(node->freq * cost);
  }
  return (double)node_local;
}

Assistant:

static double cost_and_freq( BranchSet::Node *node, double cost ) {
    if ( node->ok ) {
        if ( node->ok->freq > node->ko->freq ) {
            return cost_and_freq( node->ok.ptr(), cost + BranchSet::COST_TEST + 0 * BranchSet::COST_MISPREDICTION ) +
                   cost_and_freq( node->ko.ptr(), cost + BranchSet::COST_TEST + 1 * BranchSet::COST_MISPREDICTION );
        }
        return cost_and_freq( node->ok.ptr(), cost + BranchSet::COST_TEST + 1 * BranchSet::COST_MISPREDICTION ) +
               cost_and_freq( node->ko.ptr(), cost + BranchSet::COST_TEST + 0 * BranchSet::COST_MISPREDICTION );
    }
    return node->freq * cost;
}